

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5TextFromStmt(Fts5Config *pConfig,sqlite3_stmt *pStmt,int iCol,char **ppText,int *pnText)

{
  int iVar1;
  sqlite3_value *pVal;
  uchar *puVar2;
  int iVar3;
  long in_FS_OFFSET;
  int local_44;
  uchar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = iCol + 1;
  pVal = sqlite3_column_value(pStmt,iVar3);
  local_40 = (uchar *)0x0;
  local_44 = 0;
  if ((pConfig->bLocale != 0) && (pConfig->eContent == 2)) {
    iVar1 = sqlite3Fts5IsLocaleValue(pConfig,pVal);
    if (iVar1 != 0) {
      iVar1 = sqlite3Fts5DecodeLocaleValue(pVal,ppText,pnText,(char **)&local_40,&local_44);
      puVar2 = local_40;
      iVar3 = local_44;
      goto LAB_001ceaaa;
    }
  }
  puVar2 = sqlite3_value_text(pVal);
  *ppText = (char *)puVar2;
  iVar1 = sqlite3_value_bytes(pVal);
  *pnText = iVar1;
  if (pConfig->bLocale == 0) {
    iVar3 = 0;
    puVar2 = (uchar *)0x0;
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    if (pConfig->eContent == 0) {
      puVar2 = sqlite3_column_text(pStmt,pConfig->nCol + iVar3);
      iVar3 = sqlite3_column_bytes(pStmt,iVar3 + pConfig->nCol);
    }
    else {
      iVar3 = 0;
      puVar2 = (uchar *)0x0;
    }
  }
LAB_001ceaaa:
  (pConfig->t).pLocale = (char *)puVar2;
  (pConfig->t).nLocale = iVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5TextFromStmt(
  Fts5Config *pConfig,
  sqlite3_stmt *pStmt,
  int iCol,
  const char **ppText,
  int *pnText
){
  sqlite3_value *pVal = sqlite3_column_value(pStmt, iCol+1);
  const char *pLoc = 0;
  int nLoc = 0;
  int rc = SQLITE_OK;

  if( pConfig->bLocale
   && pConfig->eContent==FTS5_CONTENT_EXTERNAL
   && sqlite3Fts5IsLocaleValue(pConfig, pVal)
  ){
    rc = sqlite3Fts5DecodeLocaleValue(pVal, ppText, pnText, &pLoc, &nLoc);
  }else{
    *ppText = (const char*)sqlite3_value_text(pVal);
    *pnText = sqlite3_value_bytes(pVal);
    if( pConfig->bLocale && pConfig->eContent==FTS5_CONTENT_NORMAL ){
      pLoc = (const char*)sqlite3_column_text(pStmt, iCol+1+pConfig->nCol);
      nLoc = sqlite3_column_bytes(pStmt, iCol+1+pConfig->nCol);
    }
  }
  sqlite3Fts5SetLocale(pConfig, pLoc, nLoc);
  return rc;
}